

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall
duckdb::SingleFileBlockManager::VerifyBlocks
          (SingleFileBlockManager *this,
          unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
          *block_usage_count)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  __node_base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  unsigned_long uVar9;
  InternalException *pIVar10;
  _Rb_tree_header *p_Var11;
  ulong uVar12;
  uint __len;
  _Hash_node_base *p_Var13;
  _Hash_node_base *p_Var14;
  ulong __val;
  string missing_blocks;
  string __str;
  set<long,_std::less<long>,_std::allocator<long>_> referenced_blocks;
  string local_c8;
  string local_a8;
  pthread_mutex_t *local_88;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_88 = (pthread_mutex_t *)&this->block_lock;
  iVar5 = pthread_mutex_lock(local_88);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var13 = (block_usage_count->_M_h)._M_before_begin._M_nxt;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var13 != (_Hash_node_base *)0x0) {
    p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
    do {
      if (p_Var13[1]._M_nxt != (_Hash_node_base *)0xffffffffffffffff) {
        p_Var14 = p_Var13 + 1;
        if (this->max_block <= (long)p_Var13[1]._M_nxt) {
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Block %lld is used, but it is bigger than the max block %d","");
          InternalException::InternalException<long,long>
                    (pIVar10,&local_c8,(long)p_Var14->_M_nxt,this->max_block);
          __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
        _M_insert_unique<long_const&>
                  ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                   &local_80,(long *)p_Var14);
        if (p_Var13[2]._M_nxt < (_Hash_node_base *)0x2) {
          p_Var8 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var7 = &p_Var1->_M_header;
          if (p_Var8 != (_Base_ptr)0x0) {
            do {
              if ((long)p_Var14->_M_nxt <= (long)*(size_t *)(p_Var8 + 1)) {
                p_Var7 = p_Var8;
              }
              p_Var8 = (&p_Var8->_M_left)[(long)*(size_t *)(p_Var8 + 1) < (long)p_Var14->_M_nxt];
            } while (p_Var8 != (_Base_ptr)0x0);
          }
          p_Var11 = p_Var1;
          if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
             (p_Var11 = (_Rb_tree_header *)p_Var7,
             (long)p_Var14->_M_nxt < (long)((_Rb_tree_header *)p_Var7)->_M_node_count)) {
            p_Var11 = p_Var1;
          }
          if (p_Var11 != p_Var1) {
            pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"Block %lld was used, but it is present in the free list"
                       ,"");
            InternalException::InternalException<long>(pIVar10,&local_c8,(long)p_Var14->_M_nxt);
            __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
        else {
          p_Var6 = ::std::
                   _Hashtable<long,_std::pair<const_long,_unsigned_int>,_std::allocator<std::pair<const_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             (&(this->multi_use_blocks)._M_h,
                              (ulong)p_Var14->_M_nxt % (this->multi_use_blocks)._M_h._M_bucket_count
                              ,(key_type_conflict2 *)p_Var14,(__hash_code)p_Var14->_M_nxt);
          if (p_Var6 == (__node_base_ptr)0x0) {
            p_Var14 = (_Hash_node_base *)0x0;
          }
          else {
            p_Var14 = p_Var6->_M_nxt;
          }
          if (p_Var14 == (_Hash_node_base *)0x0) {
            pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,
                       "Block %lld was used %llu times, but not present in multi_use_blocks","");
            InternalException::InternalException<long,unsigned_long>
                      (pIVar10,&local_c8,(long)p_Var13[1]._M_nxt,(unsigned_long)p_Var13[2]._M_nxt);
            __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          if (p_Var13[2]._M_nxt != (_Hash_node_base *)(ulong)*(uint *)&p_Var14[2]._M_nxt) {
            pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,
                       "Block %lld was used %llu times, but multi_use_blocks says it is used %llu times"
                       ,"");
            InternalException::InternalException<long,unsigned_long,unsigned_int>
                      (pIVar10,&local_c8,(long)p_Var13[1]._M_nxt,(unsigned_long)p_Var13[2]._M_nxt,
                       *(uint *)&p_Var14[2]._M_nxt);
            __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
        }
      }
      p_Var13 = p_Var13->_M_nxt;
    } while (p_Var13 != (_Hash_node_base *)0x0);
  }
  p_Var8 = (this->free_list)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->free_list)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
      _M_insert_unique<long_const&>
                ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>> *)
                 &local_80,(long *)(p_Var8 + 1));
      p_Var8 = (_Base_ptr)::std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  sVar3 = local_80._M_impl.super__Rb_tree_header._M_node_count;
  uVar9 = NumericCastImpl<unsigned_long,_long,_false>::Convert(this->max_block);
  if (sVar3 == uVar9) {
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_80);
    pthread_mutex_unlock(local_88);
    return;
  }
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  p_Var1 = &local_80._M_impl.super__Rb_tree_header;
  if (0 < this->max_block) {
    __val = 0;
    p_Var8 = &p_Var1->_M_header;
    p_Var7 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      for (; (_Rb_tree_header *)p_Var7 != (_Rb_tree_header *)0x0;
          p_Var7 = (&p_Var7->_M_left)[(long)*(size_t *)(p_Var7 + 1) < (long)__val]) {
        if ((long)__val <= (long)*(size_t *)(p_Var7 + 1)) {
          p_Var8 = p_Var7;
        }
      }
      p_Var11 = p_Var1;
      if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
         (p_Var11 = (_Rb_tree_header *)p_Var8,
         (long)__val < (long)((_Rb_tree_header *)p_Var8)->_M_node_count)) {
        p_Var11 = p_Var1;
      }
      if (p_Var11 == p_Var1) {
        if (local_c8._M_string_length != 0) {
          ::std::__cxx11::string::append((char *)&local_c8);
        }
        __len = 1;
        if (9 < __val) {
          uVar12 = __val;
          uVar4 = 4;
          do {
            __len = uVar4;
            if (uVar12 < 100) {
              __len = __len - 2;
              goto LAB_00660cc1;
            }
            if (uVar12 < 1000) {
              __len = __len - 1;
              goto LAB_00660cc1;
            }
            if (uVar12 < 10000) goto LAB_00660cc1;
            bVar2 = 99999 < uVar12;
            uVar12 = uVar12 / 10000;
            uVar4 = __len + 4;
          } while (bVar2);
          __len = __len + 1;
        }
LAB_00660cc1:
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_a8,(char)__len);
        ::std::__detail::__to_chars_10_impl<unsigned_long>(local_a8._M_dataplus._M_p,__len,__val);
        ::std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p);
        }
      }
      __val = __val + 1;
      p_Var8 = &p_Var1->_M_header;
      p_Var7 = local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
    } while ((long)__val < this->max_block);
  }
  pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,
             "Blocks %s were neither present in the free list or in the block_usage_count (max block %lld)"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,local_c8._M_dataplus._M_p,
             local_c8._M_dataplus._M_p + local_c8._M_string_length);
  InternalException::InternalException<std::__cxx11::string,long>
            (pIVar10,&local_a8,&local_50,this->max_block);
  __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SingleFileBlockManager::VerifyBlocks(const unordered_map<block_id_t, idx_t> &block_usage_count) {
	// probably don't need this?
	lock_guard<mutex> lock(block_lock);
	// all blocks should be accounted for - either in the block_usage_count, or in the free list
	set<block_id_t> referenced_blocks;
	for (auto &block : block_usage_count) {
		if (block.first == INVALID_BLOCK) {
			continue;
		}
		if (block.first >= max_block) {
			throw InternalException("Block %lld is used, but it is bigger than the max block %d", block.first,
			                        max_block);
		}
		referenced_blocks.insert(block.first);
		if (block.second > 1) {
			// multi-use block
			auto entry = multi_use_blocks.find(block.first);
			if (entry == multi_use_blocks.end()) {
				throw InternalException("Block %lld was used %llu times, but not present in multi_use_blocks",
				                        block.first, block.second);
			}
			if (entry->second != block.second) {
				throw InternalException(
				    "Block %lld was used %llu times, but multi_use_blocks says it is used %llu times", block.first,
				    block.second, entry->second);
			}
		} else {
			D_ASSERT(block.second > 0);
			auto entry = free_list.find(block.first);
			if (entry != free_list.end()) {
				throw InternalException("Block %lld was used, but it is present in the free list", block.first);
			}
		}
	}
	for (auto &free_block : free_list) {
		referenced_blocks.insert(free_block);
	}
	if (referenced_blocks.size() != NumericCast<idx_t>(max_block)) {
		// not all blocks are accounted for
		string missing_blocks;
		for (block_id_t i = 0; i < max_block; i++) {
			if (referenced_blocks.find(i) == referenced_blocks.end()) {
				if (!missing_blocks.empty()) {
					missing_blocks += ", ";
				}
				missing_blocks += to_string(i);
			}
		}
		throw InternalException(
		    "Blocks %s were neither present in the free list or in the block_usage_count (max block %lld)",
		    missing_blocks, max_block);
	}
}